

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsProtocol.cpp
# Opt level: O0

int __thiscall xs::MessageParser::get<int>(MessageParser *this)

{
  bool bVar1;
  deBool dVar2;
  int iVar3;
  Error *this_00;
  int local_20 [2];
  int netValue;
  MessageParser *local_10;
  MessageParser *this_local;
  
  local_10 = this;
  while( true ) {
    dVar2 = deGetFalse();
    bVar1 = false;
    if (dVar2 == 0) {
      bVar1 = this->m_pos + 4 <= this->m_size;
    }
    if (!bVar1) break;
    dVar2 = deGetFalse();
    if (dVar2 == 0) {
      deMemcpy(local_20,this->m_data + this->m_pos,4);
      this->m_pos = this->m_pos + 4;
      iVar3 = networkToHost<int>(local_20[0]);
      return iVar3;
    }
  }
  this_00 = (Error *)__cxa_allocate_exception(0x10);
  Error::Error(this_00,"Invalid payload size","m_pos + sizeof(T) <= m_size",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/execserver/xsProtocol.cpp"
               ,0x3c);
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

T get (void)
	{
		XS_CHECK_MSG(m_pos + sizeof(T) <= m_size, "Invalid payload size");
		T netValue;
		deMemcpy(&netValue, &m_data[m_pos], sizeof(T));
		m_pos += sizeof(T);
		return networkToHost(netValue);
	}